

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NtpReply.h
# Opt level: O0

qint64 __thiscall NtpReply::roundTripDelay(NtpReply *this)

{
  long lVar1;
  long lVar2;
  undefined1 local_40 [8];
  undefined1 local_38 [24];
  undefined1 local_20 [8];
  undefined1 local_18 [16];
  NtpReply *this_local;
  
  local_18._8_8_ = this;
  originTime((NtpReply *)local_18);
  destinationTime((NtpReply *)local_20);
  lVar1 = QDateTime::msecsTo((QDateTime *)local_18);
  receiveTime((NtpReply *)local_38);
  transmitTime((NtpReply *)local_40);
  lVar2 = QDateTime::msecsTo((QDateTime *)local_38);
  QDateTime::~QDateTime((QDateTime *)local_40);
  QDateTime::~QDateTime((QDateTime *)local_38);
  QDateTime::~QDateTime((QDateTime *)local_20);
  QDateTime::~QDateTime((QDateTime *)local_18);
  return lVar1 - lVar2;
}

Assistant:

qint64 roundTripDelay() const {
        return originTime().msecsTo(destinationTime()) - receiveTime().msecsTo(transmitTime());
    }